

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_interface.c
# Opt level: O2

void dlep_if_remove(dlep_if *interface)

{
  list_entity *plVar1;
  avl_tree *paVar2;
  avl_tree *paVar3;
  _func_int_void_ptr_void_ptr *p_Var4;
  void *pvVar5;
  
  pvVar5 = (void *)(ulong)(interface->session).log_source;
  if (((&log_global_mask)[(long)pvVar5] & 1) != 0) {
    oonf_log(1,pvVar5,"src/generic/dlep/dlep_interface.c",0x94,0,0,"remove session %s",
             interface->l2_ifname);
  }
  paVar2 = dlep_extension_get_tree();
  while( true ) {
    paVar2 = (avl_tree *)(paVar2->list_head).next;
    plVar1 = (paVar2->list_head).prev;
    paVar3 = dlep_extension_get_tree();
    if (plVar1 == (paVar3->list_head).prev) break;
    if ((interface->session).radio == true) {
      p_Var4 = *(_func_int_void_ptr_void_ptr **)&paVar2[-1].count;
    }
    else {
      p_Var4 = paVar2[-1].comp;
    }
    if (p_Var4 != (_func_int_void_ptr_void_ptr *)0x0) {
      (*p_Var4)(interface,pvVar5);
    }
  }
  paVar2 = &_router_if_tree;
  if (interface->radio != false) {
    paVar2 = &_radio_if_tree;
  }
  avl_remove(paVar2,&interface->_node);
  oonf_packet_remove_managed(&interface->udp,true);
  dlep_session_remove(&interface->session);
  oonf_packet_free_managed_config(&interface->udp_config);
  abuf_free(&interface->udp_out);
  return;
}

Assistant:

void
dlep_if_remove(struct dlep_if *interface) {
  struct dlep_extension *ext;

  OONF_DEBUG(interface->session.log_source, "remove session %s", interface->l2_ifname);

  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (interface->session.radio) {
      if (ext->cb_session_cleanup_radio) {
        ext->cb_session_cleanup_radio(&interface->session);
      }
    }
    else {
      if (ext->cb_session_cleanup_router) {
        ext->cb_session_cleanup_router(&interface->session);
      }
    }
  }

  /* remove from tree */
  avl_remove(dlep_if_get_tree(interface->radio), &interface->_node);

  /* close UDP interface */
  oonf_packet_remove_managed(&interface->udp, true);

  /* kill dlep session */
  dlep_session_remove(&interface->session);

  /* free allocated memory data */
  oonf_packet_free_managed_config(&interface->udp_config);
  abuf_free(&interface->udp_out);
}